

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VdbeMemSetRowSet(Mem *pMem)

{
  sqlite3 *db;
  undefined1 auVar1 [16];
  uint uVar2;
  char *pcVar3;
  
  db = pMem->db;
  if (((pMem->flags & 0x2460) != 0) || (pMem->szMalloc != 0)) {
    vdbeMemClear(pMem);
  }
  pcVar3 = (char *)sqlite3DbMallocRawNN(db,0x40);
  pMem->zMalloc = pcVar3;
  if (db->mallocFailed == '\0') {
    if ((pcVar3 < (db->lookaside).pStart) || ((db->lookaside).pEnd <= pcVar3)) {
      uVar2 = (*sqlite3Config.m.xSize)(pcVar3);
      pcVar3 = pMem->zMalloc;
    }
    else {
      uVar2 = (uint)(db->lookaside).sz;
    }
    pMem->szMalloc = uVar2;
    pcVar3[0] = '\0';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    *(sqlite3 **)(pcVar3 + 8) = db;
    pcVar3[0x28] = '\0';
    pcVar3[0x29] = '\0';
    pcVar3[0x2a] = '\0';
    pcVar3[0x2b] = '\0';
    pcVar3[0x2c] = '\0';
    pcVar3[0x2d] = '\0';
    pcVar3[0x2e] = '\0';
    pcVar3[0x2f] = '\0';
    pcVar3[0x10] = '\0';
    pcVar3[0x11] = '\0';
    pcVar3[0x12] = '\0';
    pcVar3[0x13] = '\0';
    pcVar3[0x14] = '\0';
    pcVar3[0x15] = '\0';
    pcVar3[0x16] = '\0';
    pcVar3[0x17] = '\0';
    pcVar3[0x18] = '\0';
    pcVar3[0x19] = '\0';
    pcVar3[0x1a] = '\0';
    pcVar3[0x1b] = '\0';
    pcVar3[0x1c] = '\0';
    pcVar3[0x1d] = '\0';
    pcVar3[0x1e] = '\0';
    pcVar3[0x1f] = '\0';
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (ulong)uVar2 - 0x38;
    *(char **)(pcVar3 + 0x20) = pcVar3 + 0x38;
    *(short *)(pcVar3 + 0x30) = (short)(SUB164(auVar1 * ZEXT816(0xaaaaaaaaaaaaaaab),8) >> 4);
    pcVar3[0x32] = '\x01';
    pcVar3[0x33] = '\0';
    pcVar3[0x34] = '\0';
    pcVar3[0x35] = '\0';
    pcVar3[0x36] = '\0';
    pcVar3[0x37] = '\0';
    (pMem->u).zPType = pcVar3;
    pMem->flags = 0x20;
  }
  else {
    pMem->flags = 1;
    pMem->szMalloc = 0;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemSetRowSet(Mem *pMem){
  sqlite3 *db = pMem->db;
  assert( db!=0 );
  assert( (pMem->flags & MEM_RowSet)==0 );
  sqlite3VdbeMemRelease(pMem);
  pMem->zMalloc = sqlite3DbMallocRawNN(db, 64);
  if( db->mallocFailed ){
    pMem->flags = MEM_Null;
    pMem->szMalloc = 0;
  }else{
    assert( pMem->zMalloc );
    pMem->szMalloc = sqlite3DbMallocSize(db, pMem->zMalloc);
    pMem->u.pRowSet = sqlite3RowSetInit(db, pMem->zMalloc, pMem->szMalloc);
    assert( pMem->u.pRowSet!=0 );
    pMem->flags = MEM_RowSet;
  }
}